

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O1

int VP8LGetBackwardReferences
              (int width,int height,uint32_t *argb,int quality,int low_effort,int lz77_types_to_try,
              int cache_bits_max,int do_no_cache,VP8LHashChain *hash_chain,VP8LBackwardRefs *refs,
              int *cache_bits_best,WebPPicture *pic,int percent_range,int *percent)

{
  int iVar1;
  int *piVar2;
  ushort uVar3;
  ushort uVar4;
  uint32_t uVar5;
  long lVar6;
  PixOrCopyBlock **ppPVar7;
  PixOrCopyBlock **ppPVar8;
  PixOrCopyBlock *pPVar9;
  PixOrCopyBlock **ppPVar10;
  PixOrCopyBlock *pPVar11;
  PixOrCopyBlock *pPVar12;
  PixOrCopyBlock *pPVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  VP8LHashChain VVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint32_t *puVar25;
  void *ptr;
  short *psVar26;
  VP8LColorCache *pVVar27;
  VP8LHistogram *pVVar28;
  VP8LHistogram *extraout_RAX;
  VP8LHistogram *extraout_RAX_00;
  uint64_t uVar29;
  long lVar30;
  byte bVar32;
  VP8LBackwardRefs *pVVar33;
  short sVar34;
  VP8LBackwardRefs *pVVar35;
  uint uVar36;
  PixOrCopy v;
  VP8LBackwardRefs *pVVar37;
  undefined1 *puVar38;
  ulong uVar39;
  uint uVar40;
  long lVar41;
  VP8LHashChain *hash_chain_00;
  uint uVar42;
  undefined4 in_register_0000008c;
  VP8LBackwardRefs *pVVar43;
  ushort uVar44;
  uint uVar46;
  VP8LHistogram *pVVar47;
  uint uVar48;
  uint32_t *puVar49;
  PixOrCopy *pPVar50;
  ulong uVar51;
  PixOrCopyBlock *pPVar52;
  long lVar53;
  uint uVar54;
  ulong uVar55;
  PixOrCopy *pPVar56;
  bool bVar57;
  bool bVar58;
  int lz77_types_best [2];
  VP8LBackwardRefs tmp;
  int cc_init [11];
  uint local_288;
  PixOrCopy *local_260;
  VP8LHistogram *local_248;
  uint local_22c;
  PixOrCopyBlock *local_228;
  uint local_220 [2];
  VP8LHashChain local_218;
  VP8LHistogram *local_208;
  VP8LHistogram *local_200;
  VP8LBackwardRefs *local_1f8;
  PixOrCopyBlock **local_1f0;
  long local_1e8;
  long local_1e0;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  VP8LHistogram *local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  uint64_t local_1a8;
  undefined8 local_1a0;
  VP8LColorCache local_198;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  ulong uStack_f0;
  VP8LColorCache local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 auStack_58 [12];
  undefined4 local_4c;
  undefined1 auStack_48 [12];
  PixOrCopyBlock **ppPVar31;
  uint uVar45;
  
  if (low_effort == 0) {
    local_220[0] = 0;
    local_220[1] = 0;
    local_1d8 = 0xffffffff;
    uStack_1d4 = 0xffffffff;
    uStack_1d0 = 0xffffffff;
    uStack_1cc = 0xffffffff;
    local_1f8 = refs + 1;
    pVVar33 = refs + 2;
    if (do_no_cache == 0) {
      pVVar33 = local_1f8;
    }
    local_218.offset_length = (uint32_t *)0x0;
    local_218.size = 0;
    local_218._12_4_ = 0;
    local_208 = VP8LAllocateHistogram(10);
    local_22c = 1;
    if (local_208 != (VP8LHistogram *)0x0) {
      if (lz77_types_to_try != 0) {
        uVar18 = height * width;
        local_1a8 = (long)(int)uVar18;
        uVar24 = uVar18 - 2;
        ppPVar31 = &pVVar33->refs;
        local_1e0 = -(long)width;
        local_1b0 = (ulong)(uint)width << 0x20;
        local_1f0 = &refs->refs;
        local_1c0 = (ulong)uVar24 + 1;
        local_1b8 = (long)(int)uVar24;
        pVVar28 = (VP8LHistogram *)((long)(int)uVar24 * 2 + 2);
        local_1c8 = pVVar28;
        uVar24 = 1;
        do {
          uVar29 = local_1a8;
          if ((uVar24 & lz77_types_to_try) == 0) {
            iVar17 = 5;
          }
          else {
            if (uVar24 == 1) {
              uVar54 = BackwardReferencesLz77
                                 (width,height,argb,(int)hash_chain,(VP8LHashChain *)pVVar33,
                                  (VP8LBackwardRefs *)(ulong)(uint)do_no_cache);
              pVVar28 = (VP8LHistogram *)(ulong)uVar54;
            }
            else if (uVar24 == 4) {
              puVar25 = (uint32_t *)WebPSafeMalloc(local_1a8,4);
              VVar16 = local_218;
              local_218.offset_length = puVar25;
              if (puVar25 == (uint32_t *)0x0) {
                iVar17 = 2;
                pVVar28 = (VP8LHistogram *)0x0;
                goto LAB_00147947;
              }
              local_218._12_4_ = VVar16._12_4_;
              local_218.size = (int)uVar29;
              local_128 = (undefined1  [16])0x0;
              local_138 = (undefined1  [16])0x0;
              local_148 = (undefined1  [16])0x0;
              local_158 = (undefined1  [16])0x0;
              local_168 = (undefined1  [16])0x0;
              local_178 = (undefined1  [16])0x0;
              local_188 = (undefined1  [16])0x0;
              local_198.colors = (uint32_t *)0x0;
              local_198.hash_shift = 0;
              local_198.hash_bits = 0;
              local_78 = (undefined1  [16])0x0;
              local_88 = (undefined1  [16])0x0;
              local_98 = (undefined1  [16])0x0;
              local_a8 = (undefined1  [16])0x0;
              local_b8 = (undefined1  [16])0x0;
              local_c8 = (undefined1  [16])0x0;
              local_d8 = (undefined1  [16])0x0;
              local_e8.colors = (uint32_t *)0x0;
              local_e8.hash_shift = 0;
              local_e8.hash_bits = 0;
              ptr = WebPSafeMalloc(uVar29,2);
              if (ptr == (void *)0x0) {
                pVVar28 = (VP8LHistogram *)0x0;
              }
              else {
                *(undefined2 *)((long)ptr + local_1b8 * 2 + 2) = 1;
                if (1 < (int)uVar18) {
                  psVar26 = (short *)((long)ptr + (long)local_1c8);
                  lVar41 = local_1c0;
                  do {
                    sVar34 = 1;
                    if (argb[lVar41 + -1] == argb[lVar41]) {
                      sVar34 = (ushort)(*psVar26 != 0xfff) + *psVar26;
                    }
                    psVar26[-1] = sVar34;
                    psVar26 = psVar26 + -1;
                    lVar53 = lVar41 + -1;
                    bVar57 = 0 < lVar41;
                    lVar41 = lVar53;
                  } while (lVar53 != 0 && bVar57);
                }
                iVar20 = 0;
                iVar17 = 0;
                do {
                  iVar19 = -6;
                  do {
                    iVar1 = iVar20 + iVar19;
                    if ((0 < iVar1) &&
                       (iVar21 = VP8LDistanceToPlaneCode(width,iVar1), iVar21 < 0x21)) {
                      *(int *)((long)&local_1a0 + (long)iVar21 * 4 + 4) = iVar1;
                    }
                    iVar19 = iVar19 + 1;
                  } while (iVar19 != 7);
                  iVar17 = iVar17 + 1;
                  iVar20 = iVar20 + width;
                } while (iVar17 != 7);
                lVar41 = 0;
                pVVar43 = (VP8LBackwardRefs *)0x0;
                do {
                  iVar17 = *(int *)((long)&local_198.colors + lVar41 * 4);
                  if (iVar17 != 0) {
                    iVar20 = (int)pVVar43;
                    pVVar43 = (VP8LBackwardRefs *)(ulong)(iVar20 + 1);
                    *(int *)((long)&local_198.colors + (long)iVar20 * 4) = iVar17;
                  }
                  lVar41 = lVar41 + 1;
                } while (lVar41 != 0x20);
                uVar54 = (uint)pVVar43;
                if ((int)uVar54 < 1) {
                  uVar23 = 0;
                }
                else {
                  pVVar37 = (VP8LBackwardRefs *)0x0;
                  uVar23 = 0;
                  do {
                    iVar17 = *(int *)((long)&local_198.colors + (long)pVVar37 * 4);
                    pVVar35 = (VP8LBackwardRefs *)0x1;
                    do {
                      iVar20 = *(int *)((long)&local_1a0 + (long)pVVar35 * 4 + 4) + 1;
                      if (pVVar43 <= pVVar35) break;
                      pVVar35 = (VP8LBackwardRefs *)((long)&pVVar35->block_size + 1);
                    } while (iVar17 != iVar20);
                    if (iVar17 != iVar20) {
                      *(int *)((long)&local_e8.colors + (long)(int)uVar23 * 4) = iVar17;
                      uVar23 = uVar23 + 1;
                    }
                    pVVar37 = (VP8LBackwardRefs *)((long)&pVVar37->block_size + 1);
                  } while (pVVar37 != pVVar43);
                }
                *local_218.offset_length = 0;
                if (1 < (int)uVar18) {
                  puVar25 = hash_chain->offset_length;
                  pVVar37 = pVVar43 + -1;
                  uVar46 = 0xffffffff;
                  uVar51 = 1;
                  uVar36 = 0xffffffff;
                  do {
                    uVar42 = puVar25[uVar51] & 0xfff;
                    if (uVar42 == 0xfff) {
                      local_288 = puVar25[uVar51] >> 0xc;
                      if ((int)uVar54 < 1) {
                        bVar57 = false;
                      }
                      else {
                        puVar38 = (undefined1 *)0x0;
                        do {
                          bVar57 = local_288 ==
                                   *(uint *)((long)&local_198.colors + (long)puVar38 * 4);
                          if (bVar57) break;
                          bVar58 = (undefined1 *)((long)&pVVar37->last_block + 7) != puVar38;
                          puVar38 = puVar38 + 1;
                        } while (bVar58);
                      }
                    }
                    else {
                      bVar57 = false;
                    }
                    if (!bVar57) {
                      uVar42 = uVar36 - 1;
                      uVar22 = uVar23;
                      if (0xffc < uVar36 - 2) {
                        uVar42 = 0;
                        uVar46 = 0;
                        uVar22 = uVar54;
                      }
                      local_288 = uVar46;
                      if (0 < (int)uVar22) {
                        uVar55 = 0;
                        do {
                          pVVar27 = &local_198;
                          if (uVar36 - 2 < 0xffd) {
                            pVVar27 = &local_e8;
                          }
                          uVar46 = *(uint *)((long)&pVVar27->colors + uVar55 * 4);
                          uVar40 = (int)uVar51 - uVar46;
                          bVar57 = true;
                          if ((-1 < (int)uVar40) && (argb[uVar40] == argb[uVar51])) {
                            uVar48 = 0;
                            uVar39 = uVar51 & 0xffffffff;
                            do {
                              uVar4 = *(ushort *)((long)ptr + (ulong)uVar40 * 2);
                              uVar3 = *(ushort *)((long)ptr + (long)(int)uVar39 * 2);
                              uVar45 = (uint)uVar4;
                              if (uVar4 == uVar3) {
                                uVar40 = uVar40 + uVar45;
                                uVar39 = (ulong)((int)uVar39 + uVar45);
                              }
                              else {
                                uVar44 = uVar3;
                                if (uVar4 < uVar3) {
                                  uVar44 = uVar4;
                                }
                                uVar45 = (uint)uVar44;
                              }
                              uVar48 = uVar48 + uVar45;
                            } while ((((uVar4 == uVar3) && (uVar48 < 0x1000)) &&
                                     ((int)uVar39 < (int)uVar18)) &&
                                    (argb[uVar40] == argb[(int)uVar39]));
                            if ((int)uVar42 < (int)uVar48) {
                              bVar57 = uVar48 < 0xfff;
                              uVar42 = uVar48;
                              local_288 = uVar46;
                              if (!bVar57) {
                                uVar42 = 0xfff;
                              }
                            }
                          }
                        } while ((bVar57) && (uVar55 = uVar55 + 1, uVar55 < uVar22));
                      }
                    }
                    uVar22 = local_288 << 0xc | uVar42;
                    uVar36 = uVar42;
                    if ((int)uVar42 < 5) {
                      uVar22 = 0;
                      uVar36 = 0;
                    }
                    pVVar43 = (VP8LBackwardRefs *)(ulong)uVar36;
                    uVar46 = local_288;
                    if ((int)uVar42 < 5) {
                      uVar46 = 0;
                    }
                    local_218.offset_length[uVar51] = uVar22;
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar18);
                }
                *local_218.offset_length = 0;
                WebPSafeFree(ptr);
                uVar54 = BackwardReferencesLz77
                                   (width,height,argb,(int)&local_218,(VP8LHashChain *)pVVar33,
                                    pVVar43);
                pVVar28 = (VP8LHistogram *)(ulong)uVar54;
              }
            }
            else {
              pVVar28 = (VP8LHistogram *)0x0;
              if (uVar24 == 2) {
                if (pVVar33->tail != (PixOrCopyBlock **)0x0) {
                  *pVVar33->tail = pVVar33->free_blocks;
                }
                pVVar33->free_blocks = pVVar33->refs;
                pVVar33->tail = ppPVar31;
                pVVar33->last_block = (PixOrCopyBlock *)0x0;
                pVVar33->refs = (PixOrCopyBlock *)0x0;
                VP8LBackwardRefsCursorAdd(pVVar33,(PixOrCopy)((ulong)*argb << 0x20 | 0x10000));
                if (1 < (int)uVar18) {
                  uVar54 = 1;
                  do {
                    iVar17 = uVar18 - uVar54;
                    if (0xffe < (int)(uVar18 - uVar54)) {
                      iVar17 = 0xfff;
                    }
                    puVar25 = argb + uVar54;
                    iVar20 = 0;
                    iVar19 = 0;
                    if (*puVar25 == puVar25[-1]) {
                      iVar19 = (*VP8LVectorMismatch)(puVar25,argb + ((ulong)uVar54 - 1),iVar17);
                    }
                    if ((width <= (int)uVar54) && (*puVar25 == puVar25[local_1e0])) {
                      iVar20 = (*VP8LVectorMismatch)(puVar25,puVar25 + local_1e0,iVar17);
                    }
                    if ((iVar19 < 4) || (iVar19 < iVar20)) {
                      if (iVar20 < 4) {
                        v = (PixOrCopy)((ulong)*puVar25 << 0x20 | 0x10000);
                        iVar20 = 1;
                      }
                      else {
                        v = (PixOrCopy)(local_1b0 + (ulong)(uint)(iVar20 << 0x10) + 2);
                      }
                    }
                    else {
                      v = (PixOrCopy)((ulong)(uint)(iVar19 << 0x10) | 0x100000002);
                      iVar20 = iVar19;
                    }
                    VP8LBackwardRefsCursorAdd(pVVar33,v);
                    uVar54 = uVar54 + iVar20;
                  } while ((int)uVar54 < (int)uVar18);
                }
                pVVar28 = (VP8LHistogram *)(ulong)(pVVar33->error == 0);
              }
            }
            if ((int)pVVar28 == 0) {
              iVar17 = 2;
            }
            else {
              lVar41 = 1;
              local_200 = (VP8LHistogram *)0x0;
              do {
                local_288 = cache_bits_max;
                if (lVar41 == 1) {
                  local_288 = 0;
                }
                pVVar28 = (VP8LHistogram *)(ulong)(do_no_cache == 0);
                iVar17 = 9;
                if (lVar41 != 1 || do_no_cache != 0) {
                  if (lVar41 == 0) {
                    uVar54 = local_288;
                    if (quality < 0x1a) {
                      uVar54 = 0;
                    }
                    auStack_48 = SUB1612((undefined1  [16])0x0,4);
                    auStack_58 = SUB1612((undefined1  [16])0x0,0);
                    local_4c = 0;
                    local_68 = (undefined1  [16])0x0;
                    local_228 = *ppPVar31;
                    if (local_228 == (PixOrCopyBlock *)0x0) {
                      local_248 = (VP8LHistogram *)0x0;
                      local_260 = (PixOrCopy *)0x0;
                      pVVar28 = (VP8LHistogram *)ppPVar31;
                    }
                    else {
                      local_260 = local_228->start;
                      local_248 = (VP8LHistogram *)(local_260 + local_228->size);
                      pVVar28 = local_248;
                    }
                    local_a8 = (undefined1  [16])0x0;
                    local_b8 = (undefined1  [16])0x0;
                    local_c8 = (undefined1  [16])0x0;
                    local_d8 = (undefined1  [16])0x0;
                    local_e8.colors = (uint32_t *)0x0;
                    local_e8.hash_shift = 0;
                    local_e8.hash_bits = 0;
                    auVar14._8_8_ = 0;
                    auVar14._0_8_ = local_98._8_8_;
                    local_98 = auVar14 << 0x40;
                    if (uVar54 == 0) {
                      bVar57 = true;
                      local_288 = 0;
                    }
                    else {
                      local_1e8 = lVar41;
                      if (-1 < (int)uVar54) {
                        pVVar27 = &local_198;
                        uVar51 = 0;
                        do {
                          iVar17 = (int)uVar51;
                          pVVar28 = VP8LAllocateHistogram(iVar17);
                          (&local_e8.colors)[uVar51] = (uint32_t *)pVVar28;
                          bVar57 = false;
                          if (pVVar28 == (VP8LHistogram *)0x0) goto LAB_00147741;
                          VP8LHistogramInit(pVVar28,iVar17,1);
                          pVVar28 = extraout_RAX;
                          if (uVar51 != 0) {
                            uVar23 = VP8LColorCacheInit(pVVar27,iVar17);
                            pVVar28 = (VP8LHistogram *)(ulong)uVar23;
                            *(uint *)(local_68 + uVar51 * 4) = uVar23;
                            if (uVar23 == 0) goto LAB_00147741;
                          }
                          uVar51 = uVar51 + 1;
                          pVVar27 = pVVar27 + 1;
                        } while (uVar54 + 1 != uVar51);
                      }
                      if (local_260 != (PixOrCopy *)0x0) {
                        bVar32 = 0x20 - (char)uVar54;
                        local_1a0 = local_e8.colors;
                        lVar41 = (ulong)uVar54 + 1;
                        puVar25 = argb;
                        do {
                          if (local_260->mode == '\0') {
                            uVar23 = *puVar25;
                            puVar25 = puVar25 + 1;
                            pVVar28 = (VP8LHistogram *)0xff;
                            uVar51 = (ulong)(uVar23 >> 8 & 0xff);
                            local_e8.colors[(ulong)(uVar23 & 0xff) + 0x102] =
                                 local_e8.colors[(ulong)(uVar23 & 0xff) + 0x102] + 1;
                            piVar2 = (int *)(*(long *)local_e8.colors + uVar51 * 4);
                            *piVar2 = *piVar2 + 1;
                            uVar55 = (ulong)(uVar23 >> 0x10 & 0xff);
                            local_e8.colors[uVar55 + 2] = local_e8.colors[uVar55 + 2] + 1;
                            local_e8.colors[(ulong)(uVar23 >> 0x18) + 0x202] =
                                 local_e8.colors[(ulong)(uVar23 >> 0x18) + 0x202] + 1;
                            if (0 < (int)uVar54) {
                              uVar36 = uVar23 * 0x1e35a7bd >> (bVar32 & 0x1f);
                              pVVar27 = &local_198 + uVar54;
                              lVar53 = lVar41;
                              do {
                                if (pVVar27->colors[uVar36] == uVar23) {
                                  pVVar28 = (VP8LHistogram *)(long)(int)uVar36;
                                  puVar49 = (uint32_t *)
                                            (*(long *)(&uStack_f0)[lVar53] + 0x460 +
                                            (long)pVVar28 * 4);
                                }
                                else {
                                  pVVar27->colors[uVar36] = uVar23;
                                  pVVar28 = (VP8LHistogram *)(&uStack_f0)[lVar53];
                                  pVVar28->blue[uVar23 & 0xff] = pVVar28->blue[uVar23 & 0xff] + 1;
                                  pVVar28->literal[uVar51] = pVVar28->literal[uVar51] + 1;
                                  pVVar28->red[uVar55] = pVVar28->red[uVar55] + 1;
                                  puVar49 = pVVar28->alpha + (uVar23 >> 0x18);
                                }
                                *puVar49 = *puVar49 + 1;
                                uVar36 = (int)uVar36 >> 1;
                                lVar53 = lVar53 + -1;
                                pVVar27 = pVVar27 + -1;
                              } while (1 < lVar53);
                            }
                          }
                          else {
                            uVar4 = local_260->len;
                            uVar23 = (uint)uVar4;
                            if (uVar4 < 0x200) {
                              pVVar28 = (VP8LHistogram *)(ulong)(uint)uVar4;
                              uVar36 = (uint)kPrefixEncodeCode[(long)pVVar28].code;
                            }
                            else {
                              uVar46 = uVar4 - 1;
                              pVVar28 = (VP8LHistogram *)(ulong)uVar46;
                              uVar36 = 0x1f;
                              if (uVar46 != 0) {
                                for (; uVar46 >> uVar36 == 0; uVar36 = uVar36 - 1) {
                                }
                              }
                              uVar36 = (uint)((uVar46 >> ((byte)(0x1e - (char)(uVar36 ^ 0x1f)) &
                                                         0x1f) & 1) != 0) + (uVar36 ^ 0x1f) * 2 ^
                                       0x3e;
                            }
                            uVar46 = *puVar25;
                            if (-1 < (int)uVar54) {
                              uVar51 = 0;
                              do {
                                pVVar28 = *(VP8LHistogram **)(&local_e8.colors)[uVar51];
                                pVVar28->blue[(long)(int)uVar36 + -2] =
                                     pVVar28->blue[(long)(int)uVar36 + -2] + 1;
                                uVar51 = uVar51 + 1;
                              } while (uVar54 + 1 != uVar51);
                            }
                            uVar46 = ~uVar46;
                            do {
                              if (*puVar25 != uVar46) {
                                if (0 < (int)uVar54) {
                                  uVar36 = *puVar25 * 0x1e35a7bd >> (bVar32 & 0x1f);
                                  pVVar27 = &local_198 + uVar54;
                                  lVar53 = lVar41;
                                  do {
                                    pVVar28 = (VP8LHistogram *)(ulong)*puVar25;
                                    pVVar27->colors[(int)uVar36] = *puVar25;
                                    uVar36 = (int)uVar36 >> 1;
                                    lVar53 = lVar53 + -1;
                                    pVVar27 = pVVar27 + -1;
                                  } while (1 < lVar53);
                                }
                                uVar46 = *puVar25;
                              }
                              puVar25 = puVar25 + 1;
                              uVar23 = uVar23 - 1;
                            } while (uVar23 != 0);
                          }
                          local_260 = local_260 + 1;
                          if ((VP8LHistogram *)local_260 == local_248) {
                            local_228 = local_228->next;
                            if (local_228 == (PixOrCopyBlock *)0x0) {
                              local_248 = (VP8LHistogram *)0x0;
                              local_260 = (PixOrCopy *)0x0;
                              pVVar28 = (VP8LHistogram *)0x0;
                            }
                            else {
                              local_260 = local_228->start;
                              pVVar28 = (VP8LHistogram *)(local_260 + local_228->size);
                              local_248 = pVVar28;
                            }
                          }
                        } while (local_260 != (PixOrCopy *)0x0);
                      }
                      bVar57 = true;
                      if (-1 < (int)uVar54) {
                        uVar51 = 0;
                        pVVar47 = (VP8LHistogram *)0xffffffffffffffff;
                        uVar23 = local_288;
                        do {
                          pVVar28 = (VP8LHistogram *)
                                    VP8LHistogramEstimateBits
                                              ((VP8LHistogram *)(&local_e8.colors)[uVar51]);
                          local_288 = (uint)uVar51;
                          if (pVVar47 <= pVVar28 && uVar51 != 0) {
                            pVVar28 = pVVar47;
                            local_288 = uVar23;
                          }
                          uVar51 = uVar51 + 1;
                          pVVar47 = pVVar28;
                          uVar23 = local_288;
                        } while (uVar54 + 1 != uVar51);
                      }
LAB_00147741:
                      lVar41 = local_1e8;
                      if (-1 < (int)uVar54) {
                        pVVar27 = &local_198;
                        uVar51 = 0;
                        do {
                          if (*(int *)(local_68 + uVar51 * 4) != 0) {
                            VP8LColorCacheClear(pVVar27);
                          }
                          VP8LFreeHistogram((VP8LHistogram *)(&local_e8.colors)[uVar51]);
                          uVar51 = uVar51 + 1;
                          pVVar27 = pVVar27 + 1;
                          pVVar28 = extraout_RAX_00;
                          lVar41 = local_1e8;
                        } while (uVar54 + 1 != uVar51);
                      }
                    }
                    iVar17 = 2;
                    if (!bVar57) goto LAB_0014792b;
                    if (0 < (int)local_288) {
                      pPVar52 = *ppPVar31;
                      if (pPVar52 == (PixOrCopyBlock *)0x0) {
                        pPVar50 = (PixOrCopy *)0x0;
                        pPVar56 = (PixOrCopy *)0x0;
                      }
                      else {
                        pPVar56 = pPVar52->start;
                        pPVar50 = pPVar56 + pPVar52->size;
                      }
                      uVar54 = VP8LColorCacheInit(&local_198,local_288);
                      pVVar28 = (VP8LHistogram *)(ulong)uVar54;
                      if (uVar54 == 0) goto LAB_0014792b;
                      if (pPVar56 != (PixOrCopy *)0x0) {
                        iVar17 = 0;
                        do {
                          if (pPVar56->mode == '\0') {
                            uVar5 = pPVar56->argb_or_distance;
                            uVar23 = uVar5 * 0x1e35a7bd >> ((byte)local_198.hash_shift & 0x1f);
                            uVar54 = 0xffffffff;
                            if (local_198.colors[(int)uVar23] == uVar5) {
                              uVar54 = uVar23;
                            }
                            if ((int)uVar54 < 0) {
                              local_198.colors[(int)uVar23] = uVar5;
                            }
                            else {
                              *pPVar56 = (PixOrCopy)((ulong)uVar54 << 0x20 | 0x10001);
                            }
                            iVar17 = iVar17 + 1;
                          }
                          else {
                            uVar4 = pPVar56->len;
                            if (uVar4 != 0) {
                              lVar53 = 0;
                              do {
                                local_198.colors
                                [(int)(argb[iVar17 + lVar53] * 0x1e35a7bd >>
                                      ((byte)local_198.hash_shift & 0x1f))] = argb[iVar17 + lVar53];
                                lVar53 = lVar53 + 1;
                              } while ((uint)uVar4 != (uint)lVar53);
                              iVar17 = iVar17 + (uint)lVar53;
                            }
                          }
                          pPVar56 = pPVar56 + 1;
                          if (pPVar56 == pPVar50) {
                            pPVar52 = pPVar52->next;
                            if (pPVar52 == (PixOrCopyBlock *)0x0) {
                              pPVar50 = (PixOrCopy *)0x0;
                              pPVar56 = (PixOrCopy *)0x0;
                            }
                            else {
                              pPVar56 = pPVar52->start;
                              pPVar50 = pPVar56 + pPVar52->size;
                            }
                          }
                        } while (pPVar56 != (PixOrCopy *)0x0);
                      }
                      VP8LColorCacheClear(&local_198);
                    }
                  }
                  pVVar28 = local_208;
                  if (((do_no_cache == 0) || (lVar41 != 0)) || (local_288 != 0)) {
                    VP8LHistogramCreate(local_208,pVVar33,local_288);
                    local_200 = (VP8LHistogram *)VP8LHistogramEstimateBits(pVVar28);
                  }
                  pVVar28 = local_200;
                  iVar17 = 0;
                  if (local_200 < *(VP8LHistogram **)(&local_1d8 + lVar41 * 2)) {
                    if (lVar41 == 1) {
                      uVar54 = BackwardRefsClone(pVVar33,local_1f8);
                      pVVar28 = (VP8LHistogram *)(ulong)uVar54;
                      if (uVar54 == 0) {
                        iVar17 = 2;
                        goto LAB_0014792b;
                      }
                    }
                    else {
                      ppPVar7 = pVVar33->tail;
                      ppPVar8 = refs->tail;
                      pPVar52 = pVVar33->last_block;
                      local_178._0_8_ = pPVar52;
                      iVar19 = pVVar33->block_size;
                      iVar1 = pVVar33->error;
                      pPVar9 = pVVar33->refs;
                      ppPVar10 = pVVar33->tail;
                      pPVar11 = pVVar33->free_blocks;
                      local_188._0_8_ = pVVar33->tail;
                      local_188._8_8_ = pVVar33->free_blocks;
                      local_198 = *(VP8LColorCache *)pVVar33;
                      pVVar33->last_block = refs->last_block;
                      iVar17 = refs->block_size;
                      iVar20 = refs->error;
                      pPVar12 = refs->refs;
                      pPVar13 = refs->free_blocks;
                      pVVar33->tail = refs->tail;
                      pVVar33->free_blocks = pPVar13;
                      pVVar33->block_size = iVar17;
                      pVVar33->error = iVar20;
                      pVVar33->refs = pPVar12;
                      refs->last_block = pPVar52;
                      refs->tail = ppPVar10;
                      refs->free_blocks = pPVar11;
                      refs->block_size = iVar19;
                      refs->error = iVar1;
                      refs->refs = pPVar9;
                      if (ppPVar8 == local_1f0 && ppPVar8 != (PixOrCopyBlock **)0x0) {
                        pVVar33->tail = ppPVar31;
                      }
                      if (ppPVar7 != (PixOrCopyBlock **)0x0 && ppPVar7 == ppPVar31) {
                        refs->tail = local_1f0;
                      }
                    }
                    pVVar28 = local_200;
                    *(VP8LHistogram **)(&local_1d8 + lVar41 * 2) = local_200;
                    local_220[lVar41] = uVar24;
                    iVar17 = 0;
                    if (lVar41 == 0) {
                      *cache_bits_best = local_288;
                      pVVar28 = (VP8LHistogram *)cache_bits_best;
                    }
                  }
                }
LAB_0014792b:
                if ((iVar17 != 9) && (iVar17 != 0)) goto LAB_00147947;
                bVar57 = lVar41 != 0;
                lVar41 = lVar41 + -1;
              } while (bVar57);
              iVar17 = 0;
            }
          }
LAB_00147947:
          if ((iVar17 != 0) && (iVar17 != 5)) {
            if (iVar17 == 2) goto LAB_00147c6c;
            goto LAB_00147ca1;
          }
          uVar54 = ~uVar24;
          pVVar28 = (VP8LHistogram *)(ulong)uVar54;
          uVar24 = uVar24 * 2;
          lz77_types_to_try = lz77_types_to_try & uVar54;
        } while (lz77_types_to_try != 0);
      }
      uVar24 = local_220[0];
      uVar18 = local_220[1];
      lVar41 = 1;
      lVar53 = 0;
      do {
        if (do_no_cache != 0 || lVar53 != 0) {
          if (local_220[lVar41] == 1) {
            hash_chain_00 = hash_chain;
            if (0x18 < quality) {
LAB_001479d7:
              if (lVar53 == 0) {
                iVar17 = 0;
              }
              else {
                iVar17 = *cache_bits_best;
              }
              pVVar43 = (VP8LBackwardRefs *)((long)&refs[1].block_size + lVar53);
              iVar20 = VP8LBackwardReferencesTraceBackwards
                                 (width,height,argb,iVar17,hash_chain_00,pVVar43,pVVar33);
              pVVar28 = local_208;
              if (iVar20 == 0) goto LAB_00147c6c;
              VP8LHistogramCreate(local_208,pVVar33,iVar17);
              uVar29 = VP8LHistogramEstimateBits(pVVar28);
              if (uVar29 < *(ulong *)(&local_1d8 + lVar41 * 2)) {
                ppPVar31 = pVVar33->tail;
                lVar30 = (long)&refs[1].refs + lVar53;
                lVar6 = *(long *)((long)&refs[1].tail + lVar53);
                pPVar52 = pVVar33->last_block;
                local_178._0_8_ = pPVar52;
                iVar19 = pVVar33->block_size;
                iVar1 = pVVar33->error;
                pPVar9 = pVVar33->refs;
                local_198 = *(VP8LColorCache *)pVVar33;
                ppPVar7 = pVVar33->tail;
                pPVar11 = pVVar33->free_blocks;
                local_188._0_8_ = pVVar33->tail;
                local_188._8_8_ = pVVar33->free_blocks;
                pVVar33->last_block = *(PixOrCopyBlock **)((long)&refs[1].last_block + lVar53);
                iVar17 = pVVar43->block_size;
                iVar20 = pVVar43->error;
                pPVar12 = *(PixOrCopyBlock **)((long)&refs[1].refs + lVar53);
                pPVar13 = *(PixOrCopyBlock **)((long)&refs[1].free_blocks + lVar53);
                pVVar33->tail = *(PixOrCopyBlock ***)((long)&refs[1].tail + lVar53);
                pVVar33->free_blocks = pPVar13;
                pVVar33->block_size = iVar17;
                pVVar33->error = iVar20;
                pVVar33->refs = pPVar12;
                *(PixOrCopyBlock **)((long)&refs[1].last_block + lVar53) = pPVar52;
                *(PixOrCopyBlock ***)((long)&refs[1].tail + lVar53) = ppPVar7;
                *(PixOrCopyBlock **)((long)&refs[1].free_blocks + lVar53) = pPVar11;
                pVVar43->block_size = iVar19;
                pVVar43->error = iVar1;
                *(PixOrCopyBlock **)((long)&refs[1].refs + lVar53) = pPVar9;
                if (lVar30 == lVar6 && lVar6 != 0) {
                  pVVar33->tail = &pVVar33->refs;
                }
                if (ppPVar31 != (PixOrCopyBlock **)0x0 && ppPVar31 == &pVVar33->refs) {
                  *(long *)((long)&refs[1].tail + lVar53) = lVar30;
                }
              }
            }
          }
          else if ((0x18 < quality) && (hash_chain_00 = &local_218, local_220[lVar41] == 4))
          goto LAB_001479d7;
          BackwardReferences2DLocality
                    (width,(VP8LBackwardRefs *)((long)&refs[1].block_size + lVar53));
          if (((lVar53 == 0) && (uVar24 == uVar18)) && (*cache_bits_best == 0)) {
            iVar17 = BackwardRefsClone(local_1f8,refs);
            if (iVar17 == 0) goto LAB_00147c6c;
            break;
          }
        }
        lVar41 = lVar41 + -1;
        lVar53 = lVar53 + -0x28;
      } while (lVar53 != -0x50);
      local_22c = 0;
    }
LAB_00147c6c:
    WebPSafeFree(local_218.offset_length);
    local_218.size = 0;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_218._8_8_;
    local_218 = (VP8LHashChain)(auVar15 << 0x40);
    VP8LFreeHistogram(local_208);
    pVVar28 = (VP8LHistogram *)(ulong)local_22c;
LAB_00147ca1:
    if (((ulong)pVVar28 & 1) != 0) {
      iVar17 = WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar17;
    }
  }
  else {
    *cache_bits_best = 0;
    iVar17 = BackwardReferencesLz77
                       (width,height,argb,(int)hash_chain,(VP8LHashChain *)refs,
                        (VP8LBackwardRefs *)CONCAT44(in_register_0000008c,lz77_types_to_try));
    if (iVar17 == 0) {
      pVVar33 = (VP8LBackwardRefs *)0x0;
    }
    else {
      BackwardReferences2DLocality(width,refs);
      pVVar33 = refs;
    }
    if (pVVar33 == (VP8LBackwardRefs *)0x0) {
      uVar24 = WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
      ppPVar31 = (PixOrCopyBlock **)(ulong)uVar24;
    }
    else {
      ppPVar7 = pVVar33->tail;
      ppPVar31 = &pVVar33->refs;
      ppPVar8 = refs->tail;
      pPVar52 = pVVar33->last_block;
      local_178._0_8_ = pPVar52;
      iVar19 = pVVar33->block_size;
      iVar1 = pVVar33->error;
      pPVar9 = pVVar33->refs;
      local_198 = *(VP8LColorCache *)pVVar33;
      ppPVar10 = pVVar33->tail;
      pPVar11 = pVVar33->free_blocks;
      local_188._0_8_ = pVVar33->tail;
      local_188._8_8_ = pVVar33->free_blocks;
      pVVar33->last_block = refs->last_block;
      iVar17 = refs->block_size;
      iVar20 = refs->error;
      pPVar12 = refs->refs;
      pPVar13 = refs->free_blocks;
      pVVar33->tail = refs->tail;
      pVVar33->free_blocks = pPVar13;
      pVVar33->block_size = iVar17;
      pVVar33->error = iVar20;
      pVVar33->refs = pPVar12;
      refs->last_block = pPVar52;
      refs->tail = ppPVar10;
      refs->free_blocks = pPVar11;
      refs->block_size = iVar19;
      refs->error = iVar1;
      refs->refs = pPVar9;
      if (ppPVar8 == &refs->refs && ppPVar8 != (PixOrCopyBlock **)0x0) {
        pVVar33->tail = ppPVar31;
      }
      if (ppPVar7 == ppPVar31 && ppPVar7 != (PixOrCopyBlock **)0x0) {
        refs->tail = &refs->refs;
      }
    }
    if (pVVar33 == (VP8LBackwardRefs *)0x0) {
      return (int)ppPVar31;
    }
  }
  iVar17 = WebPReportProgress(pic,percent_range + *percent,percent);
  return iVar17;
}

Assistant:

int VP8LGetBackwardReferences(
    int width, int height, const uint32_t* const argb, int quality,
    int low_effort, int lz77_types_to_try, int cache_bits_max, int do_no_cache,
    const VP8LHashChain* const hash_chain, VP8LBackwardRefs* const refs,
    int* const cache_bits_best, const WebPPicture* const pic, int percent_range,
    int* const percent) {
  if (low_effort) {
    VP8LBackwardRefs* refs_best;
    *cache_bits_best = cache_bits_max;
    refs_best = GetBackwardReferencesLowEffort(
        width, height, argb, cache_bits_best, hash_chain, refs);
    if (refs_best == NULL) {
      return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    // Set it in first position.
    BackwardRefsSwap(refs_best, &refs[0]);
  } else {
    if (!GetBackwardReferences(width, height, argb, quality, lz77_types_to_try,
                               cache_bits_max, do_no_cache, hash_chain, refs,
                               cache_bits_best)) {
      return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
  }

  return WebPReportProgress(pic, *percent + percent_range, percent);
}